

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteMainCMakefile(cmGlobalUnixMakefileGenerator3 *this)

{
  pointer puVar1;
  cmMakefile *pcVar2;
  cmake *this_00;
  long lVar3;
  cmGlobalUnixMakefileGenerator3 *pcVar4;
  bool bVar5;
  string *psVar6;
  ostream *poVar7;
  ulong uVar8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  cmOutputConverter *pcVar9;
  cmLocalGenerator *this_01;
  string *outfile;
  pointer pbVar10;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *localGen;
  pointer puVar11;
  pointer pbVar12;
  cmGlobalUnixMakefileGenerator3 *pcVar13;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lfiles;
  string tmpStr;
  string check;
  string makefileName;
  string cmakefileName;
  cmGeneratedFileStream cmakefileStream;
  undefined1 local_390 [32];
  cmGlobalUnixMakefileGenerator3 *local_370;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_368;
  _Head_base<0UL,_cmLocalGenerator_*,_false> local_348;
  string local_340;
  LocalGeneratorVector *local_320;
  undefined1 local_318 [32];
  string local_2f8;
  string local_2d8;
  string local_2b8;
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  byte abStack_278 [584];
  
  local_298._0_8_ = local_288;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_298,"CMAKE_SUPPRESS_REGENERATION","");
  bVar5 = cmGlobalGenerator::GlobalSettingIsOn((cmGlobalGenerator *)this,(string *)local_298);
  if ((undefined1 *)local_298._0_8_ != local_288) {
    operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
  }
  if (!bVar5) {
    psVar6 = cmake::GetHomeOutputDirectory_abi_cxx11_
                       ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance)
    ;
    local_298._8_8_ = (psVar6->_M_dataplus)._M_p;
    local_298._0_8_ = psVar6->_M_string_length;
    local_288._0_8_ = 0x1a;
    local_288._8_8_ = "/CMakeFiles/Makefile.cmake";
    views._M_len = 2;
    views._M_array = (iterator)local_298;
    cmCatViews_abi_cxx11_(&local_2d8,views);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_298,&local_2d8,false,None);
    if ((abStack_278[*(long *)(local_298._0_8_ + -0x18)] & 5) == 0) {
      psVar6 = cmake::GetHomeOutputDirectory_abi_cxx11_
                         ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          CMakeInstance);
      local_390._8_8_ = (psVar6->_M_dataplus)._M_p;
      local_390._0_8_ = psVar6->_M_string_length;
      local_390._16_8_ = 9;
      local_390._24_8_ = (long)" -f$(ProjectPath)/Makefile" + 0x11;
      views_00._M_len = 2;
      views_00._M_array = (iterator)local_390;
      cmCatViews_abi_cxx11_(&local_2f8,views_00);
      cmLocalUnixMakefileGenerator3::WriteDisclaimer
                ((cmLocalUnixMakefileGenerator3 *)
                 (((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                   super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                 super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                 _M_t,(ostream *)local_298);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"# The generator used is:\n",0x19);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"set(CMAKE_DEPENDS_GENERATOR \"",0x1d);
      (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[3])
                (local_390,this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_298,(char *)local_390._0_8_,local_390._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\")\n\n",4);
      if ((undefined1 *)local_390._0_8_ != local_390 + 0x10) {
        operator_delete((void *)local_390._0_8_,local_390._16_8_ + 1);
      }
      local_368.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_368.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_368.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      puVar11 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
               super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_370 = this;
      if (puVar11 != puVar1) {
        do {
          pcVar2 = ((puVar11->_M_t).
                    super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                    .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_368
                     ,local_368.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
                     *(undefined8 *)
                      &(pcVar2->ListFiles).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl,
                     (pcVar2->ListFiles).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          puVar11 = puVar11 + 1;
        } while (puVar11 != puVar1);
      }
      pcVar4 = local_370;
      this_00 = (local_370->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
      bVar5 = cmake::DoWriteGlobVerifyTarget(this_00);
      if (bVar5) {
        psVar6 = cmake::GetGlobVerifyScript_abi_cxx11_(this_00);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_368,psVar6);
        psVar6 = cmake::GetGlobVerifyStamp_abi_cxx11_(this_00);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_368,psVar6);
      }
      pbVar12 = local_368.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pbVar10 = local_368.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_368.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_368.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar8 = (long)local_368.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_368.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        lVar3 = 0x3f;
        if (uVar8 != 0) {
          for (; uVar8 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::__cxx11::string>>>
                  (local_368.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_368.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::__cxx11::string>>>
                  (pbVar10,pbVar12);
      }
      __first = std::
                __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                          (local_368.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_368.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase(&local_368,(iterator)__first._M_current,
                 (iterator)
                 local_368.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      local_320 = &(pcVar4->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators;
      local_348._M_head_impl =
           *(cmLocalGenerator **)
            &(((local_320->
               super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,
                 "# The top level Makefile was generated from the following files:\n",0x41);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"set(CMAKE_MAKEFILE_DEPENDS\n",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"  \"CMakeCache.txt\"\n",0x13);
      pbVar10 = local_368.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (local_368.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_368.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pcVar9 = &(local_348._M_head_impl)->super_cmOutputConverter;
        pbVar12 = local_368.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"  \"",3);
          cmOutputConverter::MaybeRelativeToCurBinDir((string *)local_390,pcVar9,pbVar12);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_298,(char *)local_390._0_8_,local_390._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"\n",2);
          if ((undefined1 *)local_390._0_8_ != local_390 + 0x10) {
            operator_delete((void *)local_390._0_8_,local_390._16_8_ + 1);
          }
          pbVar12 = pbVar12 + 1;
        } while (pbVar12 != pbVar10);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"  )\n\n",5);
      pcVar4 = local_370;
      psVar6 = cmake::GetHomeOutputDirectory_abi_cxx11_
                         ((local_370->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          CMakeInstance);
      local_390._8_8_ = (psVar6->_M_dataplus)._M_p;
      local_390._0_8_ = psVar6->_M_string_length;
      local_390._16_8_ = 0x1d;
      local_390._24_8_ = "/CMakeFiles/cmake.check_cache";
      views_01._M_len = 2;
      views_01._M_array = (iterator)local_390;
      cmCatViews_abi_cxx11_((string *)local_318,views_01);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"# The corresponding makefile is:\n",0x21);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"set(CMAKE_MAKEFILE_OUTPUTS\n",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"  \"",3);
      pcVar9 = &(local_348._M_head_impl)->super_cmOutputConverter;
      cmOutputConverter::MaybeRelativeToCurBinDir((string *)local_390,pcVar9,&local_2f8);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_298,(char *)local_390._0_8_,local_390._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  \"",3);
      cmOutputConverter::MaybeRelativeToCurBinDir(&local_340,pcVar9,(string *)local_318);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_340._M_dataplus._M_p,local_340._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,
                        CONCAT71(local_340.field_2._M_allocated_capacity._1_7_,
                                 local_340.field_2._M_local_buf[0]) + 1);
      }
      if ((undefined1 *)local_390._0_8_ != local_390 + 0x10) {
        operator_delete((void *)local_390._0_8_,local_390._16_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"  )\n\n",5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"# Byproducts of CMake generate step:\n",0x25);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"set(CMAKE_MAKEFILE_PRODUCTS\n",0x1c);
      local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
      local_340._M_string_length = 0;
      local_340.field_2._M_local_buf[0] = '\0';
      pcVar13 = (cmGlobalUnixMakefileGenerator3 *)
                (pcVar4->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_348._M_head_impl =
           (cmLocalGenerator *)
           (pcVar4->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (pcVar13 != (cmGlobalUnixMakefileGenerator3 *)local_348._M_head_impl) {
        do {
          this_01 = (cmLocalGenerator *)
                    (pcVar13->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                    _vptr_cmGlobalGenerator;
          pbVar10 = (this_01->Makefile->OutputFiles).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar12 = (this_01->Makefile->OutputFiles).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          local_370 = pcVar13;
          if (pbVar10 != pbVar12) {
            do {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"  \"",3);
              cmOutputConverter::MaybeRelativeToTopBinDir((string *)local_390,pcVar9,pbVar10);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_298,(char *)local_390._0_8_,local_390._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"\n",2);
              if ((undefined1 *)local_390._0_8_ != local_390 + 0x10) {
                operator_delete((void *)local_390._0_8_,local_390._16_8_ + 1);
              }
              pbVar10 = pbVar10 + 1;
            } while (pbVar10 != pbVar12);
            this_01 = (cmLocalGenerator *)
                      (local_370->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                      _vptr_cmGlobalGenerator;
          }
          psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_01);
          local_390._8_8_ = (psVar6->_M_dataplus)._M_p;
          local_390._0_8_ = psVar6->_M_string_length;
          local_390._16_8_ = 0x2b;
          local_390._24_8_ = "/CMakeFiles/CMakeDirectoryInformation.cmake";
          views_02._M_len = 2;
          views_02._M_array = (iterator)local_390;
          cmCatViews_abi_cxx11_(&local_2b8,views_02);
          pcVar4 = local_370;
          std::__cxx11::string::operator=((string *)&local_340,(string *)&local_2b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"  \"",3);
          cmOutputConverter::MaybeRelativeToTopBinDir
                    ((string *)local_390,
                     (cmOutputConverter *)
                     ((pcVar4->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                      _vptr_cmGlobalGenerator + 1),&local_340);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_298,(char *)local_390._0_8_,local_390._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"\n",2);
          if ((undefined1 *)local_390._0_8_ != local_390 + 0x10) {
            operator_delete((void *)local_390._0_8_,local_390._16_8_ + 1);
          }
          pcVar13 = (cmGlobalUnixMakefileGenerator3 *)
                    &(pcVar4->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                     TryCompileTimeout;
        } while (pcVar13 != (cmGlobalUnixMakefileGenerator3 *)local_348._M_head_impl);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"  )\n\n",5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,
                        CONCAT71(local_340.field_2._M_allocated_capacity._1_7_,
                                 local_340.field_2._M_local_buf[0]) + 1);
      }
      if ((cmGlobalUnixMakefileGenerator3 *)local_318._0_8_ !=
          (cmGlobalUnixMakefileGenerator3 *)(local_318 + 0x10)) {
        operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
      }
      WriteMainCMakefileLanguageRules
                ((cmGlobalUnixMakefileGenerator3 *)local_318._0_8_,
                 (cmGeneratedFileStream *)local_298,local_320);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_368);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteMainCMakefile()
{
  if (this->GlobalSettingIsOn("CMAKE_SUPPRESS_REGENERATION")) {
    return;
  }

  // Open the output file.  This should not be copy-if-different
  // because the check-build-system step compares the makefile time to
  // see if the build system must be regenerated.
  std::string cmakefileName =
    cmStrCat(this->GetCMakeInstance()->GetHomeOutputDirectory(),
             "/CMakeFiles/Makefile.cmake");
  cmGeneratedFileStream cmakefileStream(cmakefileName);
  if (!cmakefileStream) {
    return;
  }

  std::string makefileName =
    cmStrCat(this->GetCMakeInstance()->GetHomeOutputDirectory(), "/Makefile");

  {
    // get a local generator for some useful methods
    auto& lg = cm::static_reference_cast<cmLocalUnixMakefileGenerator3>(
      this->LocalGenerators[0]);

    // Write the do not edit header.
    lg.WriteDisclaimer(cmakefileStream);
  }

  // Save the generator name
  cmakefileStream << "# The generator used is:\n"
                  << "set(CMAKE_DEPENDS_GENERATOR \"" << this->GetName()
                  << "\")\n\n";

  // for each cmMakefile get its list of dependencies
  std::vector<std::string> lfiles;
  for (const auto& localGen : this->LocalGenerators) {
    // Get the list of files contributing to this generation step.
    cm::append(lfiles, localGen->GetMakefile()->GetListFiles());
  }

  cmake* cm = this->GetCMakeInstance();
  if (cm->DoWriteGlobVerifyTarget()) {
    lfiles.push_back(cm->GetGlobVerifyScript());
    lfiles.push_back(cm->GetGlobVerifyStamp());
  }

  // Sort the list and remove duplicates.
  std::sort(lfiles.begin(), lfiles.end(), std::less<std::string>());
#if !defined(__VMS) // The Compaq STL on VMS crashes, so accept duplicates.
  auto new_end = std::unique(lfiles.begin(), lfiles.end());
  lfiles.erase(new_end, lfiles.end());
#endif

  {
    // reset lg to the first makefile
    const auto& lg = cm::static_reference_cast<cmLocalUnixMakefileGenerator3>(
      this->LocalGenerators[0]);

    // Save the list to the cmake file.
    cmakefileStream
      << "# The top level Makefile was generated from the following files:\n"
      << "set(CMAKE_MAKEFILE_DEPENDS\n"
      << "  \"CMakeCache.txt\"\n";
    for (std::string const& f : lfiles) {
      cmakefileStream << "  \"" << lg.MaybeRelativeToCurBinDir(f) << "\"\n";
    }
    cmakefileStream << "  )\n\n";

    // Build the path to the cache check file.
    std::string check =
      cmStrCat(this->GetCMakeInstance()->GetHomeOutputDirectory(),
               "/CMakeFiles/cmake.check_cache");

    // Set the corresponding makefile in the cmake file.
    cmakefileStream << "# The corresponding makefile is:\n"
                    << "set(CMAKE_MAKEFILE_OUTPUTS\n"
                    << "  \"" << lg.MaybeRelativeToCurBinDir(makefileName)
                    << "\"\n"
                    << "  \"" << lg.MaybeRelativeToCurBinDir(check) << "\"\n";
    cmakefileStream << "  )\n\n";

    // CMake must rerun if a byproduct is missing.
    cmakefileStream << "# Byproducts of CMake generate step:\n"
                    << "set(CMAKE_MAKEFILE_PRODUCTS\n";

    // add in any byproducts and all the directory information files
    std::string tmpStr;
    for (const auto& localGen : this->LocalGenerators) {
      for (std::string const& outfile :
           localGen->GetMakefile()->GetOutputFiles()) {
        cmakefileStream << "  \"" << lg.MaybeRelativeToTopBinDir(outfile)
                        << "\"\n";
      }
      tmpStr = cmStrCat(localGen->GetCurrentBinaryDirectory(),
                        "/CMakeFiles/CMakeDirectoryInformation.cmake");
      cmakefileStream << "  \"" << localGen->MaybeRelativeToTopBinDir(tmpStr)
                      << "\"\n";
    }
    cmakefileStream << "  )\n\n";
  }

  this->WriteMainCMakefileLanguageRules(cmakefileStream,
                                        this->LocalGenerators);
}